

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeFunction *
GetFunctionTypeFromCache
          (DirectChainedMap<TypeFunction_*> *table,uint hash,TypeBase *returnType,
          IntrusiveList<TypeHandle> arguments)

{
  TypeFunction *pTVar1;
  bool_type bVar2;
  bool bVar3;
  TypeHandle *local_80;
  TypeHandle *rightArg;
  TypeHandle *leftArg;
  TypeFunction *type;
  Node curr;
  TypeBase *returnType_local;
  uint hash_local;
  DirectChainedMap<TypeFunction_*> *table_local;
  IntrusiveList<TypeHandle> arguments_local;
  
  curr.node = (Node *)returnType;
  _type = DirectChainedMap<TypeFunction_*>::first(table,hash);
  bVar2 = DirectChainedMap::NodeIterator::operator_cast_to_function_pointer((NodeIterator *)&type);
  if (bVar2 != 0) {
    while (bVar2 = DirectChainedMap::NodeIterator::operator_cast_to_function_pointer
                             ((NodeIterator *)&type), bVar2 != 0) {
      pTVar1 = *(TypeFunction **)(curr.start + 8);
      if (pTVar1->returnType == (TypeBase *)curr.node) {
        rightArg = (pTVar1->arguments).head;
        local_80 = arguments.head;
        while( true ) {
          bVar3 = false;
          if ((rightArg != (TypeHandle *)0x0) && (bVar3 = false, local_80 != (TypeHandle *)0x0)) {
            bVar3 = rightArg->type == local_80->type;
          }
          if (!bVar3) break;
          rightArg = rightArg->next;
          local_80 = local_80->next;
        }
        if (rightArg == local_80) {
          return pTVar1;
        }
        _type = DirectChainedMap<TypeFunction_*>::next(table,_type);
      }
      else {
        _type = DirectChainedMap<TypeFunction_*>::next(table,_type);
      }
    }
  }
  return (TypeFunction *)0x0;
}

Assistant:

TypeFunction* GetFunctionTypeFromCache(DirectChainedMap<TypeFunction*> &table, unsigned hash, TypeBase* returnType, IntrusiveList<TypeHandle> arguments)
{
	typedef DirectChainedMap<TypeFunction*>::NodeIterator Node;

	if(Node curr = table.first(hash))
	{
		while(curr)
		{
			TypeFunction *type = curr.node->value;

			if(type->returnType != returnType)
			{
				curr = table.next(curr);
				continue;
			}

			TypeHandle *leftArg = type->arguments.head;
			TypeHandle *rightArg = arguments.head;

			while(leftArg && rightArg && leftArg->type == rightArg->type)
			{
				leftArg = leftArg->next;
				rightArg = rightArg->next;
			}

			if(leftArg != rightArg)
			{
				curr = table.next(curr);
				continue;
			}

			return type;
		}
	}

	return NULL;
}